

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_ObjDelay(Gia_Man_t *pNew,int iObj,int nLutSize,Vec_Int_t *vDelay)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  iVar1 = Vec_IntEntry(vDelay,iObj);
  if (iVar1 == 0) {
    if ((pNew->pMuxes == (uint *)0x0) || (pNew->pMuxes[iObj] == 0)) {
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar1 = Vec_IntEntry(vDelay,iObj - (*(uint *)pGVar4 & 0x1fffffff));
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar2 = Vec_IntEntry(vDelay,iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
      iVar1 = Str_Delay2(iVar1,iVar2,nLutSize);
    }
    else {
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar1 = Vec_IntEntry(vDelay,iObj - (*(uint *)pGVar4 & 0x1fffffff));
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar2 = Vec_IntEntry(vDelay,iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
      iVar3 = Gia_ObjFaninId2(pNew,iObj);
      iVar3 = Vec_IntEntry(vDelay,iVar3);
      iVar1 = Str_Delay3(iVar1,iVar2,iVar3,nLutSize);
    }
    Vec_IntWriteEntry(vDelay,iObj,iVar1);
  }
  return iVar1;
}

Assistant:

static inline int Str_ObjDelay( Gia_Man_t * pNew, int iObj, int nLutSize, Vec_Int_t * vDelay )
{
    int Delay = Vec_IntEntry( vDelay, iObj );
    if ( Delay == 0 )
    {
        if ( Gia_ObjIsMuxId(pNew, iObj) )
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            int d2 = Vec_IntEntry( vDelay, Gia_ObjFaninId2(pNew, iObj) );
            Delay = Str_Delay3( d0, d1, d2, nLutSize );
        }
        else
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            Delay = Str_Delay2( d0, d1, nLutSize );
        }
        Vec_IntWriteEntry( vDelay, iObj, Delay );
    }
    return Delay;
}